

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture2_BasisCompressTest_Compress_Test::TestBody
          (ktxTexture2_BasisCompressTest_Compress_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  long in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ktx_error_code_e result;
  ktx_uint64_t dataSize;
  ktxTexture2 *texture;
  char (*in_stack_fffffffffffffd98) [37];
  AssertionResult *in_stack_fffffffffffffda0;
  ktxSupercmpScheme *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  int line;
  Message *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  Type type;
  AssertHelper *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffe00;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  AssertionResult *in_stack_fffffffffffffe18;
  AssertHelper *in_stack_fffffffffffffe20;
  AssertionResult local_1c0;
  string local_1b0 [55];
  undefined1 local_179;
  AssertionResult local_178 [2];
  undefined4 local_154;
  AssertionResult local_150 [2];
  undefined4 local_12c;
  AssertionResult local_128;
  string local_118 [55];
  undefined1 local_e1;
  AssertionResult local_e0;
  string local_d0 [40];
  AssertHelper *local_a8;
  undefined1 local_91;
  AssertionResult local_90;
  uint local_7c;
  string local_78 [71];
  undefined1 local_31;
  AssertionResult local_30;
  int local_1c;
  undefined8 local_18;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_1c = ktxTexture2_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),1,local_10
                         );
    local_31 = local_1c == 0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffda0,(bool *)in_stack_fffffffffffffd98,(type *)0x157ec3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                 (char *)in_stack_fffffffffffffe08._M_head_impl,in_stack_fffffffffffffe00);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,
                 (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_78);
      testing::Message::~Message((Message *)0x157f84);
    }
    local_7c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x15802e);
    if (local_7c == 0) {
      local_91 = local_10[0] != 0;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffffda0,(bool *)in_stack_fffffffffffffd98,(type *)0x15806e);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
        testing::Message::operator<<((Message *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98)
        ;
        in_stack_fffffffffffffdd0 = (AssertHelper *)ktxErrorString(local_1c);
        local_a8 = in_stack_fffffffffffffdd0;
        pMVar2 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffda0,(char **)in_stack_fffffffffffffd98)
        ;
        type = (Type)((ulong)pMVar2 >> 0x20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                   (char *)in_stack_fffffffffffffe08._M_head_impl,in_stack_fffffffffffffe00);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,
                   (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffda0);
        std::__cxx11::string::~string(local_d0);
        testing::Message::~Message((Message *)0x158192);
      }
      local_7c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x15823c);
      if (local_7c == 0) {
        local_e1 = *(long *)(local_10[0] + 0x70) != 0;
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffda0,(bool *)in_stack_fffffffffffffd98,(type *)0x158280);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
          in_stack_fffffffffffffdc0 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffda0,
                          (char (*) [22])in_stack_fffffffffffffd98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                     (char *)in_stack_fffffffffffffe08._M_head_impl,in_stack_fffffffffffffe00);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,
                     (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffda0);
          std::__cxx11::string::~string(local_118);
          testing::Message::~Message((Message *)0x15836b);
        }
        local_7c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x158418);
        if (local_7c == 0) {
          local_18 = *(undefined8 *)(local_10[0] + 0x68);
          local_1c = ktxTexture2_CompressBasis(local_10[0],0);
          local_12c = 0;
          testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                    (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                     (ktx_error_code_e *)in_stack_fffffffffffffda0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
            in_stack_fffffffffffffdb8 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x1584d0);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,
                       (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffda0);
            testing::Message::~Message((Message *)0x15852d);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x15859b);
          local_154 = 1;
          testing::internal::EqHelper::Compare<ktxSupercmpScheme,_ktxSupercmpScheme,_nullptr>
                    (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                     (ktxSupercmpScheme *)in_stack_fffffffffffffda0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
            in_stack_fffffffffffffdb0 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x15861e);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,
                       (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffda0);
            testing::Message::~Message((Message *)0x15867b);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1586e9);
          local_179 = **(long **)(local_10[0] + 0xa0) != 0;
          testing::AssertionResult::AssertionResult<bool>
                    (in_stack_fffffffffffffda0,(bool *)in_stack_fffffffffffffd98,(type *)0x158721);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_178);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                       (char *)in_stack_fffffffffffffe08._M_head_impl,in_stack_fffffffffffffe00);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,
                       (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffda0);
            std::__cxx11::string::~string(local_1b0);
            testing::Message::~Message((Message *)0x1587f4);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x158888);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                     (uint *)in_stack_fffffffffffffda0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
            in_stack_fffffffffffffda8 =
                 (ktxSupercmpScheme *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x1588fe);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,
                       (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffda0);
            testing::Message::~Message((Message *)0x15895b);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1589c9);
          testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                    (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                     (unsigned_long *)in_stack_fffffffffffffda8,
                     (unsigned_long *)in_stack_fffffffffffffda0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe20);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
            in_stack_fffffffffffffda0 =
                 (AssertionResult *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x158a3e);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,
                       (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffda0);
            testing::Message::~Message((Message *)0x158a92);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x158afd);
          local_1c = ktxTexture2_TranscodeBasis(local_10[0],2,0);
          testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                    (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                     (ktx_error_code_e *)in_stack_fffffffffffffda0);
          line = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe00);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
            testing::AssertionResult::failure_message((AssertionResult *)0x158b82);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffdd0,type,(char *)in_stack_fffffffffffffdc0,line,
                       in_stack_fffffffffffffdb0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffda0);
            testing::Message::~Message((Message *)0x158bce);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x158c30);
          if (local_10[0] != 0) {
            (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture2_BasisCompressTest, Compress) {
    ktxTexture2* texture;
    ktx_uint64_t dataSize;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture2_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        dataSize = texture->dataSize;
        result = ktxTexture2_CompressBasis(texture, 0);
        EXPECT_EQ(result, KTX_SUCCESS);
        EXPECT_EQ(texture->supercompressionScheme, KTX_SS_BASIS_LZ);
        EXPECT_TRUE(texture->_private->_supercompressionGlobalData > (ktx_uint8_t*)0);
        EXPECT_EQ(texture->numLevels, helper.numLevels);
        EXPECT_LT(texture->dataSize, dataSize);
        // How else to test the result?

        result = ktxTexture2_TranscodeBasis(texture, KTX_TTF_BC1_RGB, 0);
        EXPECT_EQ(result, KTX_SUCCESS);
        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));
    }
}